

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.h
# Opt level: O2

bool __thiscall UnifiedRegex::CharBitvec::IsSubsetOf(CharBitvec *this,CharBitvec *other)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar2 == 8) break;
    uVar1 = uVar2 + 1;
  } while ((this->vec[uVar2] & ~other->vec[uVar2]) == 0);
  return 7 < uVar2;
}

Assistant:

inline bool IsSubsetOf(const CharBitvec& other) const
        {
            for (int w = 0; w < vecSize; w++)
            {
                uint32 v = other.vec[w];
                if (v != (vec[w] | v))
                {
                    return false;
                }
            }
            return true;
        }